

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O1

int loadJson(string *fjson,json *inj)

{
  ostream *poVar1;
  ifstream ifs;
  istream aiStack_228 [520];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Loading JSON input file \"",0x19);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(fjson->_M_dataplus)._M_p,fjson->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" ...",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::ifstream::ifstream(aiStack_228,(string *)fjson,_S_in);
  nlohmann::operator>>(aiStack_228,inj);
  std::ifstream::close();
  std::ifstream::~ifstream(aiStack_228);
  return 0;
}

Assistant:

int loadJson(std::string& fjson, json& inj)
{
	std::cout << "Loading JSON input file \"" << fjson << "\" ..." << std::endl;
	std::ifstream ifs(fjson, std::ifstream::in);

	try
	{
		ifs >> inj;
		ifs.close();  // close to release lock on file
	}
	catch (const std::exception& e)
	{
		std::cout << "\nError:  cannot load JSON input file \"" << fjson << "\"." << std::endl;
		std::cout << e.what() << std::endl;
		return irwincolor::ERR_JSON;
	}

	return 0;
}